

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_udev.cc
# Opt level: O3

void __thiscall
ccel::udev::virtual_keyboard_handler::virtual_keyboard_handler
          (virtual_keyboard_handler *this,io_service *io,string *dev_name,int flags)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  random_generator *this_00;
  ulong uVar5;
  ssize_t sVar6;
  runtime_error *this_01;
  ulong uVar7;
  uuid uVar8;
  emplace_return eVar9;
  uint local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  (this->super_base_handler)._vptr_base_handler = (_func_int **)&PTR___cxa_pure_virtual_00125800;
  (this->super_base_handler).__handler_io = io;
  this_00 = uuid_t::rand_uuid();
  uVar8 = boost::uuids::
          basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
          ::operator()(this_00);
  *&(this->super_base_handler)._handler_uuid.super_uuid.data = uVar8.data;
  (this->super_base_handler)._buffer_size = 0x4e8;
  (this->super_base_handler)._vptr_base_handler = (_func_int **)&PTR_open_00125778;
  boost::unordered::
  unordered_map<int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>_>
  ::unordered_map(&this->__key_proprety);
  memset(&this->_udev,0,0x45c);
  local_38 = &(this->_dev_name).field_2;
  (this->_dev_name)._M_dataplus._M_p = (pointer)local_38;
  pcVar2 = (dev_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_dev_name,pcVar2,pcVar2 + dev_name->_M_string_length);
  this->_open = true;
  iVar4 = ::open("/dev/uinput",flags);
  this->_fd = iVar4;
  ioctl(iVar4,0x40045565,0x39);
  local_3c = 0;
  uVar5 = 0;
  do {
    ioctl(this->_fd,0x40045565,uVar5);
    eVar9 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,int,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,int,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::hash<int>,std::equal_to<int>>>
                        *)&this->__key_proprety,(int *)&local_3c);
    ((eVar9.first.node_.node_)->value_base_).data_.data_.buf[4] = '\0';
    *(undefined4 *)((long)&((eVar9.first.node_.node_)->value_base_).data_.data_ + 8) = 0x14;
    uVar1 = local_3c + 1;
    uVar5 = (ulong)uVar1;
    bVar3 = (int)local_3c < 0xf7;
    local_3c = uVar1;
  } while (bVar3);
  ioctl(this->_fd,0x40045564,1);
  ioctl(this->_fd,0x40045564,2);
  if ((this->_dev_name)._M_string_length != 0) {
    uVar5 = 0;
    uVar7 = 1;
    do {
      (this->_udev).name[uVar5] = (this->_dev_name)._M_dataplus._M_p[uVar5];
      bVar3 = uVar7 < (this->_dev_name)._M_string_length;
      uVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3);
  }
  (this->_udev).id.bustype = 3;
  (this->_udev).id.vendor = 1;
  (this->_udev).id.product = 1;
  (this->_udev).id.version = 1;
  sVar6 = write(this->_fd,&this->_udev,0x45c);
  if (sVar6 < 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Write uinput file descriptor failed.");
  }
  else {
    iVar4 = ioctl(this->_fd,0x5501);
    if (iVar4 == 0) {
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Create virtual keyboard failed.");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual_keyboard_handler::virtual_keyboard_handler(boost::asio::io_service &io,
                                                   const std::string dev_name,
                                                   const int flags)
    : base_handler(io, sizeof(virtual_keyboard_handler)), _udev{},
      _dev_name{dev_name}, _open(true) {
  // Init the udev handler
  // Open the uinput file descriptor
  _fd = ::open("/dev/uinput", flags);
  // NOTICE THAT THIS IS NOT ccel::base_handler::open()
  ioctl(_fd, UI_SET_KEYBIT, KEY_SPACE);
  for (auto i = 0; i < 248; i++) {
    ioctl(_fd, UI_SET_KEYBIT, i); // Bind and allow keycodes from 0 to 248
    __key_proprety[i] =
        boost::make_tuple(false, 20); // Default click time in  20 ms
  }
  ioctl(_fd, UI_SET_EVBIT, EV_KEY);
  ioctl(_fd, UI_SET_EVBIT, EV_REL);

  for (unsigned i = 0; i < _dev_name.length(); i++) {
    _udev.name[i] = _dev_name[i];
  }
  _udev.id.bustype = BUS_USB;
  _udev.id.vendor = 0x1;
  _udev.id.product = 0x1;
  _udev.id.version = 1;
  if (write(_fd, &_udev, sizeof(_udev)) < 0)
    throw std::runtime_error("Write uinput file descriptor failed.");
  if (ioctl(_fd, UI_DEV_CREATE) != 0) {
    throw std::runtime_error("Create virtual keyboard failed.");
  };
}